

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::setRowVisible(QFormLayout *this,int row,bool on)

{
  QFormLayoutItem *pQVar1;
  QFormLayoutItem *pQVar2;
  QFormLayoutItem **ppQVar3;
  byte in_DL;
  long *in_RDI;
  bool change;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  QFormLayoutPrivate *d;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar4;
  
  d_func((QFormLayout *)0x4b8937);
  ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                      ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                       CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  pQVar1 = *ppQVar3;
  ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                      ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                       CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  pQVar2 = *ppQVar3;
  bVar4 = 0;
  if (pQVar1 != (QFormLayoutItem *)0x0) {
    bVar4 = (pQVar1->isVisible & 1U) != (in_DL & 1);
    QFormLayoutItem::setVisible
              ((QFormLayoutItem *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),
               SUB81((ulong)in_RDI >> 0x38,0));
  }
  if (pQVar2 != (QFormLayoutItem *)0x0) {
    bVar4 = (bVar4 & 1) != 0 || (pQVar2->isVisible & 1U) != (in_DL & 1);
    QFormLayoutItem::setVisible
              ((QFormLayoutItem *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),
               SUB81((ulong)in_RDI >> 0x38,0));
  }
  if ((bVar4 & 1) != 0) {
    (**(code **)(*in_RDI + 0x70))();
  }
  return;
}

Assistant:

void QFormLayout::setRowVisible(int row, bool on)
{
    Q_D(QFormLayout);
    QFormLayoutItem *label = d->m_matrix(row, 0);
    QFormLayoutItem *field = d->m_matrix(row, 1);
    bool change = false;
    if (label) {
        change = label->isVisible != on;
        label->setVisible(on);
    }
    if (field) {
        change |= field->isVisible != on;
        field->setVisible(on);
    }
    if (change)
        invalidate();
}